

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O3

int message_create_IoTHubMessage_from_uamqp_message
              (MESSAGE_HANDLE uamqp_message,IOTHUB_MESSAGE_HANDLE *iothubclient_message)

{
  bool bVar1;
  BINARY_DATA *pBVar2;
  int iVar3;
  AMQP_TYPE AVar4;
  IOTHUB_MESSAGE_RESULT IVar5;
  MAP_RESULT MVar6;
  LOGGER_LOG p_Var7;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  MAP_HANDLE handle;
  AMQP_VALUE map;
  int iVar8;
  size_t __n;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  char *string_value;
  AMQP_VALUE uamqp_message_property;
  PROPERTIES_HANDLE uamqp_message_properties;
  uint32_t property_count;
  uint64_t ulong_value;
  MESSAGE_BODY_TYPE body_type;
  BINARY_DATA binary_data;
  BINARY_DATA *local_f8;
  AMQP_VALUE local_f0;
  PROPERTIES_HANDLE local_e8;
  uint32_t local_dc;
  amqp_binary local_d8;
  MESSAGE_BODY_TYPE local_bc;
  BINARY_DATA local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar3 = message_get_body_type(uamqp_message,&local_bc);
  if (iVar3 != 0) {
    p_Var7 = xlogging_get_log_function();
    iVar3 = 0x479;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return 0x479;
    }
    pcVar10 = "Failed to get the type of the uamqp message.";
    iVar8 = 0x478;
LAB_0014266a:
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
              ,"message_create_IoTHubMessage_from_uamqp_message",iVar8,1,pcVar10);
    return iVar3;
  }
  if (local_bc != MESSAGE_BODY_TYPE_DATA) {
    return 0x471;
  }
  iVar3 = message_get_body_amqp_data_in_place(uamqp_message,0,&local_b8);
  if (iVar3 != 0) {
    p_Var7 = xlogging_get_log_function();
    iVar3 = 0x483;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return 0x483;
    }
    pcVar10 = "Failed to get the body of the uamqp message.";
    iVar8 = 0x482;
    goto LAB_0014266a;
  }
  iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(local_b8.bytes,local_b8.length);
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var7 = xlogging_get_log_function();
    iVar3 = 0x488;
    if (p_Var7 == (LOGGER_LOG)0x0) {
      return 0x488;
    }
    pcVar10 = 
    "Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed)."
    ;
    iVar8 = 0x487;
    goto LAB_0014266a;
  }
  iVar3 = message_get_properties(uamqp_message,&local_e8);
  if (iVar3 != 0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",999,1,
                "Failed to get property properties map from uAMQP message.");
    }
    goto LAB_00142f0f;
  }
  iVar3 = properties_get_message_id(local_e8,&local_f0);
  if ((local_f0 == (AMQP_VALUE)0x0 || iVar3 != 0) ||
     (AVar4 = amqpvalue_get_type(local_f0), AVar4 == AMQP_TYPE_NULL)) {
LAB_001427a0:
    iVar3 = properties_get_correlation_id(local_e8,&local_f0);
    if ((local_f0 == (AMQP_VALUE)0x0 || iVar3 != 0) ||
       (AVar4 = amqpvalue_get_type(local_f0), AVar4 == AMQP_TYPE_NULL)) {
LAB_001427d3:
      iVar3 = properties_get_user_id(local_e8,&local_d8);
      if (local_d8.length != 0 && iVar3 == 0) {
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8.bytes = (uchar *)0x0;
        local_b8.length = 0;
        __n = 0x7f;
        if (local_d8.length < 0x7f) {
          __n = (size_t)local_d8.length;
        }
        strncpy((char *)&local_b8,(char *)local_d8.bytes,__n);
        IVar5 = IoTHubMessage_SetMessageUserIdSystemProperty(iotHubMessageHandle,(char *)&local_b8);
        if (IVar5 == IOTHUB_MESSAGE_OK) goto LAB_001428c3;
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readUserIdFromuAQMPMessage",0x3d4,1,
                    "Failed to set IOTHUB_MESSAGE_HANDLE \'user-id\' property.");
        }
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00142f05;
        pcVar10 = "Failed readUserIdFromuAQMPMessage.";
        iVar3 = 0x3fa;
        goto LAB_00142efa;
      }
LAB_001428c3:
      local_b8.bytes = (uchar *)0x0;
      iVar3 = properties_get_content_type(local_e8,(char **)&local_b8);
      bVar1 = true;
      if ((local_b8.bytes != (uchar *)0x0 && iVar3 == 0) &&
         (IVar5 = IoTHubMessage_SetContentTypeSystemProperty
                            (iotHubMessageHandle,(char *)local_b8.bytes), IVar5 != IOTHUB_MESSAGE_OK
         )) {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 == (LOGGER_LOG)0x0) {
          bVar1 = false;
        }
        else {
          bVar1 = false;
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readPropertiesFromuAMQPMessage",0x405,1,
                    "Failed to set IOTHUB_MESSAGE_HANDLE \'content-type\' property.");
        }
      }
      local_b8.bytes = (uchar *)0x0;
      iVar3 = properties_get_content_encoding(local_e8,(char **)&local_b8);
      if ((local_b8.bytes == (uchar *)0x0 || iVar3 != 0) ||
         (IVar5 = IoTHubMessage_SetContentEncodingSystemProperty
                            (iotHubMessageHandle,(char *)local_b8.bytes), IVar5 == IOTHUB_MESSAGE_OK
         )) {
        properties_destroy(local_e8);
        if (!bVar1) goto LAB_00142f0f;
        local_b8.bytes = (uchar *)0x0;
        local_dc = 0;
        handle = IoTHubMessage_Properties(iotHubMessageHandle);
        if (handle == (MAP_HANDLE)0x0) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0014312c;
          pcVar10 = "Failed to get property map from IoTHub message.";
          iVar3 = 0x426;
        }
        else {
          iVar3 = message_get_application_properties(uamqp_message,(AMQP_VALUE *)&local_b8);
          if (iVar3 == 0) {
            if ((AMQP_VALUE)local_b8.bytes == (AMQP_VALUE)0x0) {
LAB_00143353:
              *iothubclient_message = iotHubMessageHandle;
              return 0;
            }
            map = amqpvalue_get_inplace_described_value((AMQP_VALUE)local_b8.bytes);
            if (map == (AMQP_VALUE)0x0) {
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                iVar3 = 0;
                pcVar10 = 
                "Failed getting the map of uAMQP message application properties (return code %d).";
                iVar8 = 0x438;
LAB_00143117:
                (*p_Var7)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                          ,"readApplicationPropertiesFromuAMQPMessage",iVar8,1,pcVar10,iVar3);
              }
            }
            else {
              iVar3 = amqpvalue_get_map_pair_count(map,&local_dc);
              if (iVar3 == 0) {
                if (local_dc == 0) {
                  amqpvalue_destroy((AMQP_VALUE)local_b8.bytes);
                }
                else {
                  uVar9 = 1;
                  do {
                    local_d8.bytes = (AMQP_VALUE)0x0;
                    local_f0 = (AMQP_VALUE)0x0;
                    iVar3 = amqpvalue_get_map_key_value_pair
                                      (map,uVar9 - 1,(AMQP_VALUE *)&local_d8,&local_f0);
                    if (iVar3 != 0) {
                      p_Var7 = xlogging_get_log_function();
                      if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00143122;
                      pcVar10 = 
                      "Failed reading the key/value pair from the uAMQP property map (return code %d)."
                      ;
                      iVar8 = 0x44c;
                      goto LAB_00143117;
                    }
                    iVar3 = amqpvalue_get_string((AMQP_VALUE)local_d8.bytes,(char **)&local_f8);
                    if (iVar3 == 0) {
                      iVar3 = amqpvalue_get_string(local_f0,(char **)&local_e8);
                      if (iVar3 == 0) {
                        MVar6 = Map_AddOrUpdate(handle,(char *)local_f8,(char *)local_e8);
                        bVar1 = true;
                        if (MVar6 == MAP_OK) goto LAB_0014330c;
                        p_Var7 = xlogging_get_log_function();
                        if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00143309;
                        iVar3 = 0x45e;
                        pcVar10 = "Failed to add/update IoTHub message property map.";
                      }
                      else {
                        p_Var7 = xlogging_get_log_function();
                        if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_00143309;
                        iVar3 = 0x459;
                        pcVar10 = "Failed parsing the uAMQP property value (return code %d).";
                      }
LAB_00143302:
                      bVar1 = false;
                      (*p_Var7)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                                ,"readApplicationPropertiesFromuAMQPMessage",iVar3,1,pcVar10);
                    }
                    else {
                      p_Var7 = xlogging_get_log_function();
                      if (p_Var7 != (LOGGER_LOG)0x0) {
                        iVar3 = 0x454;
                        pcVar10 = "Failed parsing the uAMQP property name (return code %d).";
                        goto LAB_00143302;
                      }
LAB_00143309:
                      bVar1 = false;
                    }
LAB_0014330c:
                    amqpvalue_destroy((AMQP_VALUE)local_d8.bytes);
                    amqpvalue_destroy(local_f0);
                  } while ((bVar1) && (bVar11 = uVar9 < local_dc, uVar9 = uVar9 + 1, bVar11));
                  amqpvalue_destroy((AMQP_VALUE)local_b8.bytes);
                  if (!bVar1) goto LAB_0014312c;
                }
                goto LAB_00143353;
              }
              p_Var7 = xlogging_get_log_function();
              if (p_Var7 != (LOGGER_LOG)0x0) {
                pcVar10 = 
                "Failed reading the number of values in the uAMQP property map (return code %d).";
                iVar8 = 0x43d;
                goto LAB_00143117;
              }
            }
LAB_00143122:
            amqpvalue_destroy((AMQP_VALUE)local_b8.bytes);
            goto LAB_0014312c;
          }
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 == (LOGGER_LOG)0x0) goto LAB_0014312c;
          pcVar10 = "Failed reading the incoming uAMQP message properties (return code %d).";
          iVar3 = 0x42b;
        }
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readApplicationPropertiesFromuAMQPMessage",iVar3,1,pcVar10);
LAB_0014312c:
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"message_create_IoTHubMessage_from_uamqp_message",0x497,1,
                    "Failed reading application properties of the uamqp message.");
        }
        IoTHubMessage_Destroy(iotHubMessageHandle);
        return 0x499;
      }
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 != (LOGGER_LOG)0x0) {
        pcVar10 = "Failed to set IOTHUB_MESSAGE_HANDLE \'content-encoding\' property.";
        iVar3 = 0x410;
        goto LAB_00142efa;
      }
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8.bytes = (uchar *)0x0;
      local_b8.length = 0;
      if (AVar4 == AMQP_TYPE_ULONG) {
        iVar3 = amqpvalue_get_ulong(local_f0,(uint64_t *)&local_d8);
        if (iVar3 == 0) {
          iVar3 = sprintf((char *)&local_b8,"%lu",local_d8.bytes);
          pBVar2 = &local_b8;
          if (iVar3 < 0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar10 = "Failed converting \'correlation-id\' (ulong) to string";
              iVar3 = 0x382;
              goto LAB_00142ddd;
            }
            goto LAB_00142de8;
          }
        }
        else {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed to get value of uAMQP message \'correlation-id\' property (ulong)";
            iVar3 = 0x37d;
LAB_00142ddd:
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readCorrelationIdFromuAQMPMessage",iVar3,1,pcVar10);
          }
LAB_00142de8:
          local_f8 = (BINARY_DATA *)0x0;
          pBVar2 = local_f8;
        }
LAB_00142df4:
        local_f8 = pBVar2;
        bVar1 = false;
LAB_00142df7:
        if (local_f8 == (BINARY_DATA *)0x0) goto LAB_00142e9d;
        IVar5 = IoTHubMessage_SetCorrelationId(iotHubMessageHandle,(char *)local_f8);
        if ((IVar5 != IOTHUB_MESSAGE_OK) &&
           (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readCorrelationIdFromuAQMPMessage",0x3a7,1,
                    "Failed to set IOTHUB_MESSAGE_HANDLE \'correlation-id\' property.");
        }
        if (bVar1) {
          free(local_f8);
        }
        if (IVar5 == IOTHUB_MESSAGE_OK) goto LAB_001427d3;
      }
      else {
        if (AVar4 == AMQP_TYPE_UUID) {
          iVar3 = amqpvalue_get_uuid(local_f0,(uuid *)&local_d8);
          if (iVar3 != 0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar10 = "Failed to get value of uAMQP message \'correlation-id\' property (UUID)";
              iVar3 = 0x390;
              goto LAB_00142ddd;
            }
            goto LAB_00142de8;
          }
          local_f8 = (BINARY_DATA *)UUID_to_string((UUID_T *)&local_d8);
          if (local_f8 == (BINARY_DATA *)0x0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              pcVar10 = "Failed to get the string representation of \'correlation-id\' UUID";
              iVar3 = 0x395;
              goto LAB_00142ddd;
            }
            goto LAB_00142de8;
          }
          bVar1 = true;
          goto LAB_00142df7;
        }
        if (AVar4 == AMQP_TYPE_STRING) {
          iVar3 = amqpvalue_get_string(local_f0,(char **)&local_f8);
          pBVar2 = local_f8;
          if (iVar3 == 0) goto LAB_00142df4;
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed to get value of uAMQP message \'correlation-id\' property (string)";
            iVar3 = 0x373;
            goto LAB_00142e89;
          }
        }
        else {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar10 = "Unrecognized type for correlation-id (%d)";
            iVar3 = 0x39f;
LAB_00142e89:
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readCorrelationIdFromuAQMPMessage",iVar3,1,pcVar10);
          }
        }
        local_f8 = (BINARY_DATA *)0x0;
LAB_00142e9d:
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readCorrelationIdFromuAQMPMessage",0x3b7,1,
                    "Unexpected null string for correlation-id");
        }
      }
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 != (LOGGER_LOG)0x0) {
        pcVar10 = "Failed readCorrelationIdFromuAQMPMessage.";
        iVar3 = 0x3f5;
        goto LAB_00142efa;
      }
    }
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.bytes = (uchar *)0x0;
    local_b8.length = 0;
    if (AVar4 == AMQP_TYPE_ULONG) {
      iVar3 = amqpvalue_get_ulong(local_f0,(uint64_t *)&local_d8);
      if (iVar3 == 0) {
        iVar3 = sprintf((char *)&local_b8,"%lu",local_d8.bytes);
        pBVar2 = &local_b8;
        if (iVar3 < 0) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed converting \'message-id\' (ulong) to string";
            iVar3 = 0x318;
            goto LAB_00142b0b;
          }
          goto LAB_00142b16;
        }
      }
      else {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get value of uAMQP message \'message-id\' property (ulong)";
          iVar3 = 0x313;
LAB_00142b0b:
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",iVar3,1,pcVar10);
        }
LAB_00142b16:
        local_f8 = (BINARY_DATA *)0x0;
        pBVar2 = local_f8;
      }
LAB_00142b22:
      local_f8 = pBVar2;
      bVar1 = false;
LAB_00142b25:
      if (local_f8 == (BINARY_DATA *)0x0) goto LAB_00142bcb;
      IVar5 = IoTHubMessage_SetMessageId(iotHubMessageHandle,(char *)local_f8);
      if ((IVar5 != IOTHUB_MESSAGE_OK) &&
         (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readMessageIdFromuAQMPMessage",0x33d,1,
                  "Failed to set IOTHUB_MESSAGE_HANDLE \'message-id\' property.");
      }
      if (bVar1) {
        free(local_f8);
      }
      if (IVar5 == IOTHUB_MESSAGE_OK) goto LAB_001427a0;
    }
    else {
      if (AVar4 == AMQP_TYPE_UUID) {
        iVar3 = amqpvalue_get_uuid(local_f0,(uuid *)&local_d8);
        if (iVar3 != 0) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed to get value of uAMQP message \'message-id\' property (UUID)";
            iVar3 = 0x326;
            goto LAB_00142b0b;
          }
          goto LAB_00142b16;
        }
        local_f8 = (BINARY_DATA *)UUID_to_string((UUID_T *)&local_d8);
        if (local_f8 == (BINARY_DATA *)0x0) {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed to get the string representation of \'message-id\' UUID";
            iVar3 = 0x32b;
            goto LAB_00142b0b;
          }
          goto LAB_00142b16;
        }
        bVar1 = true;
        goto LAB_00142b25;
      }
      if (AVar4 == AMQP_TYPE_STRING) {
        iVar3 = amqpvalue_get_string(local_f0,(char **)&local_f8);
        pBVar2 = local_f8;
        if (iVar3 == 0) goto LAB_00142b22;
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get value of uAMQP message \'message-id\' property (string)";
          iVar3 = 0x309;
          goto LAB_00142bb7;
        }
      }
      else {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar10 = "Unrecognized type for message-id (%d)";
          iVar3 = 0x335;
LAB_00142bb7:
          (*p_Var7)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",iVar3,1,pcVar10);
        }
      }
      local_f8 = (BINARY_DATA *)0x0;
LAB_00142bcb:
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 != (LOGGER_LOG)0x0) {
        (*p_Var7)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readMessageIdFromuAQMPMessage",0x34d,1,"Unexpected null string for message-id");
      }
    }
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      pcVar10 = "Failed readMessageIdFromuAQMPMessage.";
      iVar3 = 0x3f0;
LAB_00142efa:
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",iVar3,1,pcVar10);
    }
  }
LAB_00142f05:
  properties_destroy(local_e8);
LAB_00142f0f:
  p_Var7 = xlogging_get_log_function();
  if (p_Var7 != (LOGGER_LOG)0x0) {
    (*p_Var7)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
              ,"message_create_IoTHubMessage_from_uamqp_message",0x491,1,
              "Failed reading properties of the uamqp message.");
  }
  IoTHubMessage_Destroy(iotHubMessageHandle);
  return 0x493;
}

Assistant:

int message_create_IoTHubMessage_from_uamqp_message(MESSAGE_HANDLE uamqp_message, IOTHUB_MESSAGE_HANDLE* iothubclient_message)
{
    int result = MU_FAILURE;

    IOTHUB_MESSAGE_HANDLE iothub_message = NULL;
    MESSAGE_BODY_TYPE body_type;

    if (message_get_body_type(uamqp_message, &body_type) != 0)
    {
        LogError("Failed to get the type of the uamqp message.");
        result = MU_FAILURE;
    }
    else
    {
        if (body_type == MESSAGE_BODY_TYPE_DATA)
        {
            BINARY_DATA binary_data;
            if (message_get_body_amqp_data_in_place(uamqp_message, 0, &binary_data) != 0)
            {
                LogError("Failed to get the body of the uamqp message.");
                result = MU_FAILURE;
            }
            else if ((iothub_message = IoTHubMessage_CreateFromByteArray(binary_data.bytes, binary_data.length)) == NULL)
            {
                LogError("Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed).");
                result = MU_FAILURE;
            }
        }
    }

    if (iothub_message != NULL)
    {
        if (readPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else if (readApplicationPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading application properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else
        {
            *iothubclient_message = iothub_message;
            result = RESULT_OK;
        }
    }

    return result;
}